

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O3

char * __thiscall
cppcms::impl::url_rewriter::rule::rewrite_once(rule *this,cmatch *m,string_pool *pool)

{
  int iVar1;
  pointer ppVar2;
  pointer pbVar3;
  size_t sVar4;
  char *__s;
  pointer piVar5;
  long lVar6;
  ptrdiff_t _Num_1;
  char *__src;
  long lVar7;
  long lVar8;
  long lVar9;
  size_t sVar10;
  char *__dest;
  ptrdiff_t _Num;
  char *pcVar11;
  size_t __n;
  ulong uVar12;
  
  sVar10 = this->pattern_size;
  piVar5 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = (long)(this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar5;
  if (lVar6 != 0) {
    lVar6 = lVar6 >> 2;
    ppVar2 = (m->offsets_).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = 0;
    do {
      iVar1 = piVar5[lVar7];
      lVar8 = (long)iVar1;
      if (lVar8 < 0) {
LAB_00106dd0:
        lVar9 = 0;
      }
      else {
        lVar9 = 0;
        if (iVar1 < (int)((ulong)((long)(m->offsets_).
                                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2)
                         >> 3)) {
          if ((long)ppVar2[lVar8].first == -1) goto LAB_00106dd0;
          lVar9 = (long)ppVar2[lVar8].second - (long)ppVar2[lVar8].first;
        }
      }
      sVar10 = sVar10 + lVar9;
      lVar7 = lVar7 + 1;
    } while (lVar6 + (ulong)(lVar6 == 0) != lVar7);
  }
  __s = string_pool::allocate_space(pool,sVar10 + 1);
  memset(__s,0,sVar10 + 1);
  piVar5 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  __dest = __s;
  if ((this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar5) {
    lVar6 = 8;
    uVar12 = 0;
    do {
      pbVar3 = (this->pattern).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar4 = *(size_t *)((long)&(pbVar3->_M_dataplus)._M_p + lVar6);
      if (sVar4 != 0) {
        memmove(__dest,*(void **)((long)pbVar3 + lVar6 + -8),sVar4);
        piVar5 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      lVar7 = (long)piVar5[uVar12];
      if ((lVar7 < 0) ||
         (ppVar2 = (m->offsets_).
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start,
         (int)((ulong)((long)(m->offsets_).
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2) >> 3) <=
         piVar5[uVar12])) {
        __n = 0;
      }
      else {
        __src = m->begin_ + ppVar2[lVar7].first;
        pcVar11 = (char *)0x0;
        if ((long)ppVar2[lVar7].first == -1) {
          __src = (char *)0x0;
        }
        else {
          pcVar11 = m->begin_ + ppVar2[lVar7].second;
        }
        __n = (long)pcVar11 - (long)__src;
        if (__n != 0) {
          memmove(__dest + sVar4,__src,__n);
          piVar5 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        }
      }
      __dest = __dest + sVar4 + __n;
      uVar12 = uVar12 + 1;
      lVar6 = lVar6 + 0x20;
    } while (uVar12 < (ulong)((long)(this->index).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)piVar5 >> 2));
  }
  pbVar3 = (this->pattern).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  sVar4 = pbVar3[-1]._M_string_length;
  if (sVar4 != 0) {
    memmove(__dest,pbVar3[-1]._M_dataplus._M_p,sVar4);
  }
  __dest[sVar4] = '\0';
  return __s;
}

Assistant:

char *rewrite_once(booster::cmatch const &m,string_pool &pool) const
		{
			size_t total_size = pattern_size;
			for(size_t i=0;i<index.size();i++) {
				total_size += m[index[i]].length();
			}
			char *new_url = pool.alloc(total_size+1);
			char *ptr = new_url;
			for(size_t i=0;i<index.size();i++) {
				ptr = std::copy(pattern[i].begin(),pattern[i].end(),ptr);
				ptr = std::copy(m[index[i]].first,m[index[i]].second,ptr);
			}
			ptr = std::copy(pattern.back().begin(),pattern.back().end(),ptr);
			*ptr = 0;
			return new_url;
		}